

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# debug.cpp
# Opt level: O0

void __thiscall log_queue::stop(log_queue *this)

{
  log_entry *this_00;
  size_type sVar1;
  reference pplVar2;
  log_entry *top;
  unique_lock<std::mutex> lock;
  log_queue *this_local;
  
  lock._8_8_ = this;
  std::unique_lock<std::mutex>::unique_lock((unique_lock<std::mutex> *)&top,&this->queue_mutex);
  this->active = false;
  while (sVar1 = std::
                 queue<log_queue::log_entry_*,_std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>_>
                 ::size(&this->queue), sVar1 != 0) {
    pplVar2 = std::
              queue<log_queue::log_entry_*,_std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>_>
              ::front(&this->queue);
    this_00 = *pplVar2;
    std::
    queue<log_queue::log_entry_*,_std::deque<log_queue::log_entry_*,_std::allocator<log_queue::log_entry_*>_>_>
    ::pop(&this->queue);
    if (this_00 != (log_entry *)0x0) {
      log_entry::~log_entry(this_00);
      operator_delete(this_00,0x48);
    }
  }
  std::condition_variable::notify_all();
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)&top);
  return;
}

Assistant:

void stop() {
            std::unique_lock<std::mutex> lock(queue_mutex);
            active = false;

            while (queue.size() > 0) {
                log_entry* top = queue.front();
                queue.pop();
                delete top;
            }

            wait_for_next_item_condition.notify_all();
        }